

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monochrome_test.cc
# Opt level: O3

bool __thiscall
anon_unknown.dwarf_191e68f::MonochromeTest::ComparePlaneToValue
          (MonochromeTest *this,aom_image_t *img,int plane,int value)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  
  uVar1 = aom_img_plane_width((aom_image_t *)this,(int)img);
  uVar2 = aom_img_plane_height((aom_image_t *)this,(int)img);
  if (0 < (int)uVar2) {
    lVar3 = *(long *)(&(this->super_EncoderTest).cfg_.g_h + ((ulong)img & 0xffffffff) * 2);
    uVar4 = 0;
    bVar6 = false;
    do {
      if (0 < (int)uVar1) {
        uVar5 = 0;
        do {
          if ((uint)*(byte *)(lVar3 + uVar5) != plane) {
            return bVar6;
          }
          uVar5 = uVar5 + 1;
        } while (uVar1 != uVar5);
      }
      uVar4 = uVar4 + 1;
      bVar6 = uVar2 <= uVar4;
      lVar3 = lVar3 + (&(this->super_EncoderTest).cfg_.g_timebase.num)[(ulong)img & 0xffffffff];
    } while (uVar4 != uVar2);
  }
  return true;
}

Assistant:

bool ComparePlaneToValue(const aom_image_t &img, const int plane,
                           const int value) {
    const int w = aom_img_plane_width(&img, plane);
    const int h = aom_img_plane_height(&img, plane);
    const uint8_t *const buf = img.planes[plane];
    const int stride = img.stride[plane];

    for (int r = 0; r < h; ++r) {
      for (int c = 0; c < w; ++c) {
        if (buf[r * stride + c] != value) return false;
      }
    }
    return true;
  }